

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

void __thiscall FIX::FileStore::reset(FileStore *this,UtcTimeStamp *now)

{
  int __oflag;
  exception *e;
  UtcTimeStamp *now_local;
  FileStore *this_local;
  
  MemoryStore::reset(&this->m_cache,now);
  std::
  map<unsigned_long,_std::pair<long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
  ::clear(&this->m_offsets);
  open(this,(char *)0x1,__oflag);
  setSession(this);
  return;
}

Assistant:

EXCEPT(IOException) {
  try {
    m_cache.reset(now);
    m_offsets.clear();
    open(true);
    setSession();
  } catch (std::exception &e) {
    throw IOException(e.what());
  }
}